

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O3

int ConnectMDM(MDM *pMDM,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  byte local_138;
  char local_137;
  
  memset(pMDM->szCfgFilePath,0,0x100);
  sprintf(pMDM->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pMDM->szDevPath + 5,0,0xfb);
    builtin_strncpy(pMDM->szDevPath,"COM1",5);
    pMDM->BaudRate = 0x2580;
    pMDM->timeout = 8000;
    pMDM->threadperiod = 100;
    pMDM->bSaveRawData = 1;
    pMDM->MessageLen = 4;
    pMDM->InternalBufferSize = 0x100;
    pMDM->ModemBitRate = 0x28;
    pMDM->DelayReadWriteEchoByte = 0x14;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
LAB_001145f3:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_0011462a;
          if (local_138 != 0x24) {
LAB_00114642:
            if (pcVar2 != (char *)0x0) goto LAB_00114653;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114642;
          goto LAB_001145f3;
        }
LAB_0011462a:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00114653:
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pMDM->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_0011467f:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001146b6;
          if (local_138 != 0x24) {
LAB_001146c2:
            if (pcVar2 != (char *)0x0) goto LAB_001146d3;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001146c2;
          goto LAB_0011467f;
        }
LAB_001146b6:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001146d3:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_001146ff:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00114736;
          if (local_138 != 0x24) {
LAB_00114742:
            if (pcVar2 != (char *)0x0) goto LAB_00114753;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114742;
          goto LAB_001146ff;
        }
LAB_00114736:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00114753:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_0011477f:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001147b6;
          if (local_138 != 0x24) {
LAB_001147c2:
            if (pcVar2 != (char *)0x0) goto LAB_001147d3;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001147c2;
          goto LAB_0011477f;
        }
LAB_001147b6:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001147d3:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00114801:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00114838;
          if (local_138 != 0x24) {
LAB_00114844:
            if (pcVar2 != (char *)0x0) goto LAB_00114855;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114844;
          goto LAB_00114801;
        }
LAB_00114838:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00114855:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00114883:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001148ba;
          if (local_138 != 0x24) {
LAB_001148c6:
            if (pcVar2 != (char *)0x0) goto LAB_001148d7;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001148c6;
          goto LAB_00114883;
        }
LAB_001148ba:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001148d7:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->MessageLen);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00114905:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_0011493c;
          if (local_138 != 0x24) {
LAB_00114948:
            if (pcVar2 != (char *)0x0) goto LAB_00114959;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114948;
          goto LAB_00114905;
        }
LAB_0011493c:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00114959:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->InternalBufferSize);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00114987:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001149be;
          if (local_138 != 0x24) {
LAB_001149ca:
            if (pcVar2 != (char *)0x0) goto LAB_001149db;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001149ca;
          goto LAB_00114987;
        }
LAB_001149be:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001149db:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->ModemBitRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00114a09:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00114a40;
          if (local_138 != 0x24) {
LAB_00114a4c:
            if (pcVar2 != (char *)0x0) goto LAB_00114a5d;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00114a4c;
          goto LAB_00114a09;
        }
LAB_00114a40:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00114a5d:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pMDM->DelayReadWriteEchoByte);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_00114a9e;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_00114a9e:
  if (pMDM->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pMDM->threadperiod = 100;
  }
  iVar1 = OpenRS232Port(&pMDM->RS232Port,pMDM->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pMDM->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pMDM->RS232Port).hDev,pMDM->BaudRate,'\0',0,'\b','\0',pMDM->timeout),
         iVar1 != 0)) {
        puts("Unable to connect to a MDM.");
        CloseRS232Port(&pMDM->RS232Port);
        goto LAB_00114adc;
      }
      tcflush(*(int *)&(pMDM->RS232Port).hDev,2);
    }
    puts("MDM connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a MDM.");
LAB_00114adc:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectMDM(MDM* pMDM, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pMDM->szCfgFilePath, 0, sizeof(pMDM->szCfgFilePath));
	sprintf(pMDM->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMDM->szDevPath, 0, sizeof(pMDM->szDevPath));
		sprintf(pMDM->szDevPath, "COM1");
		pMDM->BaudRate = 9600;
		pMDM->timeout = 8000;
		pMDM->threadperiod = 100;
		pMDM->bSaveRawData = 1;
		pMDM->MessageLen = 4;
		pMDM->InternalBufferSize = 256;
		pMDM->ModemBitRate = 40;
		pMDM->DelayReadWriteEchoByte = 20;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMDM->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->MessageLen) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->InternalBufferSize) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->ModemBitRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->DelayReadWriteEchoByte) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMDM->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMDM->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pMDM->pfSaveFile = NULL;

	if (OpenRS232Port(&pMDM->RS232Port, pMDM->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MDM.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMDM->RS232Port, pMDM->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pMDM->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MDM.\n");
		CloseRS232Port(&pMDM->RS232Port);
		return EXIT_FAILURE;
	}

	printf("MDM connected.\n");

	return EXIT_SUCCESS;
}